

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_int_&,_const_unsigned_long_&> * __thiscall
Catch::ExprLhs<int_const&>::operator!=
          (BinaryExpr<const_int_&,_const_unsigned_long_&> *__return_storage_ptr__,
          ExprLhs<int_const&> *this,unsigned_long *rhs)

{
  int *lhs;
  bool comparisonResult;
  StringRef local_30;
  unsigned_long *local_20;
  unsigned_long *rhs_local;
  ExprLhs<const_int_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (unsigned_long *)this;
  this_local = (ExprLhs<const_int_&> *)__return_storage_ptr__;
  comparisonResult = compareNotEqual<int,unsigned_long_const&>(*(int **)this,rhs);
  lhs = *(int **)this;
  StringRef::StringRef(&local_30,"!=");
  BinaryExpr<const_int_&,_const_unsigned_long_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }